

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

timestamp_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::date_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::date_t> *accessor)

{
  date_t dVar1;
  CURSOR *pCVar2;
  timestamp_t tVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [12];
  timestamp_t result_1;
  timestamp_t local_58;
  string local_50;
  
  pCVar2 = accessor->data;
  uVar6 = (pCVar2->scan).current_row_index;
  bVar4 = (pCVar2->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar6 || bVar4) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(date_t **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
      uVar6 = (pCVar2->scan).current_row_index;
    }
    dVar1.days = pCVar2->data[(uint)((int)lidx - (int)uVar6)].days;
    bVar4 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar1,&local_58,false);
    if (!bVar4) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)(ulong)(uint)dVar1.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (lidx < uVar6 || bVar4) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(date_t **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
      uVar6 = (pCVar2->scan).current_row_index;
    }
    dVar1.days = pCVar2->data[(uint)((int)lidx - (int)uVar6)].days;
    bVar4 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar1,&local_58,false);
    tVar3.value = local_58.value;
    if (!bVar4) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)(ulong)(uint)dVar1.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar2 = accessor->data;
    uVar6 = (pCVar2->scan).current_row_index;
    if ((pCVar2->scan).next_row_index <= hidx || hidx < uVar6) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)hidx,(DataChunk *)&pCVar2->scan);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(date_t **)(pvVar5 + 0x20);
      pvVar5 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = (ValidityMask *)(pvVar5 + 0x28);
      uVar6 = (pCVar2->scan).current_row_index;
    }
    dVar1.days = pCVar2->data[(uint)((int)hidx - (int)uVar6)].days;
    bVar4 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar1,&local_58,false);
    if (!bVar4) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)(ulong)(uint)dVar1.days,(date_t)auVar8._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar7 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_58.value = llround(dVar7 * (double)local_58.value + (1.0 - dVar7) * (double)tVar3.value);
  }
  return (timestamp_t)local_58.value;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}